

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_15::LCSSARewriter::LCSSARewriter
          (LCSSARewriter *this,IRContext *context,DominatorTree *dom_tree,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *exit_bb,BasicBlock *merge_block)

{
  CFG *pCVar1;
  uint32_t local_44;
  BasicBlock *merge_block_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *exit_bb_local;
  DominatorTree *dom_tree_local;
  IRContext *context_local;
  LCSSARewriter *this_local;
  
  this->context_ = context;
  pCVar1 = IRContext::cfg(this->context_);
  this->cfg_ = pCVar1;
  this->dom_tree_ = dom_tree;
  this->exit_bb_ = exit_bb;
  if (merge_block == (BasicBlock *)0x0) {
    local_44 = 0;
  }
  else {
    local_44 = BasicBlock::id(merge_block);
  }
  this->merge_block_id_ = local_44;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&this->bb_to_defining_blocks_);
  return;
}

Assistant:

LCSSARewriter(IRContext* context, const DominatorTree& dom_tree,
                const std::unordered_set<BasicBlock*>& exit_bb,
                BasicBlock* merge_block)
      : context_(context),
        cfg_(context_->cfg()),
        dom_tree_(dom_tree),
        exit_bb_(exit_bb),
        merge_block_id_(merge_block ? merge_block->id() : 0) {}